

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathFuncs.cpp
# Opt level: O3

float grow(float x,int y)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"grow (",6);
  poVar1 = std::ostream::_M_insert<double>((double)x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (0 < y) {
    do {
      x = x * x;
      y = y + -1;
    } while (y != 0);
  }
  return x;
}

Assistant:

float
grow (float x, int y)
{
    std::cout << "grow (" << x << ", " << y << ")" << std::endl;

    for (int i = 0; i < y; i++)
	x = x * x;

    return x;
}